

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_set.h
# Opt level: O3

void __thiscall merlin::variable_set::variable_set(variable_set *this,variable *v,variable *v2)

{
  ulong uVar1;
  ulong *puVar2;
  value_type_conflict1 *__val;
  pointer puVar3;
  size_t *psVar4;
  
  (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar3 = (pointer)operator_new(0x10);
  (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = puVar3;
  (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar3 + 2;
  *puVar3 = 0;
  puVar3[1] = 0;
  (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar3 + 2;
  (this->m_dlocal).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dlocal).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dlocal).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar4 = (size_t *)operator_new(0x10);
  (this->m_dlocal).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = psVar4;
  (this->m_dlocal).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = psVar4 + 2;
  *psVar4 = 0;
  psVar4[1] = 0;
  (this->m_dlocal).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = psVar4 + 2;
  uVar1 = v->m_label;
  if (uVar1 < v2->m_label) {
    puVar2 = (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    *puVar2 = uVar1;
    *psVar4 = v->m_states;
    puVar2[1] = v2->m_label;
    psVar4[1] = v2->m_states;
  }
  else {
    puVar2 = (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (v2->m_label < uVar1) {
      puVar2[1] = uVar1;
      psVar4[1] = v->m_states;
      *puVar2 = v2->m_label;
      *psVar4 = v2->m_states;
    }
    else {
      *puVar2 = uVar1;
      *psVar4 = v->m_states;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->m_v,1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->m_dlocal,1);
      psVar4 = (this->m_dlocal).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
  }
  this->m_d = psVar4;
  return;
}

Assistant:

variable_set(const variable& v, const variable& v2) :
			m_v(2), m_dlocal(2) {
		if (v.label() < v2.label()) {
			m_v[0] = v.label();
			m_dlocal[0] = v.states();
			m_v[1] = v2.label();
			m_dlocal[1] = v2.states();
			m_d = &m_dlocal[0];
		} else if (v2.label() < v.label()) {
			m_v[1] = v.label();
			m_dlocal[1] = v.states();
			m_v[0] = v2.label();
			m_dlocal[0] = v2.states();
			m_d = &m_dlocal[0];
		} else {
			m_v[0] = v.label();
			m_dlocal[0] = v.states();
			m_v.resize(1);
			m_dlocal.resize(1);
			m_d = &m_dlocal[0];
		}
	}